

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O1

int __thiscall cmCTestBuildAndTestHandler::ProcessHandler(cmCTestBuildAndTestHandler *this)

{
  int iVar1;
  string output;
  
  (this->Output)._M_string_length = 0;
  *(this->Output)._M_dataplus._M_p = '\0';
  cmSystemTools::s_FatalErrorOccurred = false;
  cmSystemTools::s_ErrorOccurred = false;
  iVar1 = RunCMakeAndTest(this,&this->Output);
  cmSystemTools::s_FatalErrorOccurred = false;
  cmSystemTools::s_ErrorOccurred = false;
  return iVar1;
}

Assistant:

int cmCTestBuildAndTestHandler::ProcessHandler()
{
  this->Output.clear();
  std::string output;
  cmSystemTools::ResetErrorOccurredFlag();
  int retv = this->RunCMakeAndTest(&this->Output);
  cmSystemTools::ResetErrorOccurredFlag();
  return retv;
}